

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::FormulasLoader::appendNewNode(FormulasLoader *this,INode *node)

{
  _Elt_pointer pvVar1;
  INode *local_8;
  
  if (node != (INode *)0x0) {
    pvVar1 = (this->mNodeListStack).c.
             super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_8 = node;
    if (pvVar1 == (this->mNodeListStack).c.
                  super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      COLLADAFW::ArrayPrimitiveType<MathML::AST::INode_*>::append
                (&this->mCurrentFormula->mMathmlAsts,&local_8);
    }
    else {
      if (pvVar1 == (this->mNodeListStack).c.
                    super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar1 = (this->mNodeListStack).c.
                 super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::push_back
                (pvVar1 + -1,&local_8);
    }
  }
  return true;
}

Assistant:

bool FormulasLoader::appendNewNode( MathML::AST::INode* node )
	{
		if ( node )
		{
			if ( mNodeListStack.empty() )
				mCurrentFormula->getMathmlAsts().append( node );
			else
				mNodeListStack.top().push_back( node );
		}
		else
		{
			// TODO error handling
		}
		return true;
	}